

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O0

REF_STATUS
ref_search_selection(REF_MPI ref_mpi,REF_INT n,REF_DBL *elements,REF_LONG position,REF_DBL *value)

{
  double *pdVar1;
  REF_DBL RVar2;
  uint uVar3;
  REF_DBL local_a0;
  REF_DBL local_98;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL mid_val;
  REF_DBL temp;
  REF_DBL high_val;
  REF_DBL low_val;
  REF_LONG count;
  REF_LONG high_pos;
  REF_LONG low_pos;
  REF_INT bisection;
  REF_INT i;
  REF_DBL *value_local;
  REF_LONG position_local;
  REF_DBL *elements_local;
  REF_MPI pRStack_18;
  REF_INT n_local;
  REF_MPI ref_mpi_local;
  
  high_pos = 0;
  count = (REF_LONG)n;
  _bisection = value;
  value_local = (REF_DBL *)position;
  position_local = (REF_LONG)elements;
  elements_local._4_4_ = n;
  pRStack_18 = ref_mpi;
  uVar3 = ref_mpi_allsum(ref_mpi,&count,1,2);
  if (uVar3 == 0) {
    count = count + -1;
    high_val = 1e+200;
    temp = -1e+200;
    for (low_pos._4_4_ = 0; low_pos._4_4_ < elements_local._4_4_; low_pos._4_4_ = low_pos._4_4_ + 1)
    {
      if (*(double *)(position_local + (long)low_pos._4_4_ * 8) <= high_val) {
        local_98 = *(REF_DBL *)(position_local + (long)low_pos._4_4_ * 8);
      }
      else {
        local_98 = high_val;
      }
      high_val = local_98;
      pdVar1 = (double *)(position_local + (long)low_pos._4_4_ * 8);
      if (temp < *pdVar1 || temp == *pdVar1) {
        local_a0 = *(REF_DBL *)(position_local + (long)low_pos._4_4_ * 8);
      }
      else {
        local_a0 = temp;
      }
      temp = local_a0;
    }
    mid_val = high_val;
    uVar3 = ref_mpi_min(pRStack_18,&mid_val,&high_val,3);
    if (uVar3 == 0) {
      uVar3 = ref_mpi_bcast(pRStack_18,&high_val,1,3);
      if (uVar3 == 0) {
        mid_val = temp;
        uVar3 = ref_mpi_max(pRStack_18,&mid_val,&temp,3);
        if (uVar3 == 0) {
          uVar3 = ref_mpi_bcast(pRStack_18,&temp,1,3);
          if (uVar3 == 0) {
            if (high_pos < (long)value_local) {
              if ((long)value_local < count) {
                _ref_private_macro_code_rss_1 = (high_val + temp) * 0.5;
                for (low_pos._0_4_ = 0; (int)low_pos < 0x28; low_pos._0_4_ = (int)low_pos + 1) {
                  _ref_private_macro_code_rss_1 = (high_val + temp) * 0.5;
                  low_val = 0.0;
                  for (low_pos._4_4_ = 0; low_pos._4_4_ < elements_local._4_4_;
                      low_pos._4_4_ = low_pos._4_4_ + 1) {
                    if (*(double *)(position_local + (long)low_pos._4_4_ * 8) <=
                        _ref_private_macro_code_rss_1) {
                      low_val = (REF_DBL)((long)low_val + 1);
                    }
                  }
                  uVar3 = ref_mpi_allsum(pRStack_18,&low_val,1,2);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                           ,0x1bc,"ref_search_selection",(ulong)uVar3,"bcast");
                    return uVar3;
                  }
                  RVar2 = _ref_private_macro_code_rss_1;
                  if ((long)low_val + -1 < (long)value_local) {
                    RVar2 = temp;
                    high_val = _ref_private_macro_code_rss_1;
                  }
                  temp = RVar2;
                }
                *_bisection = _ref_private_macro_code_rss_1;
                ref_mpi_local._4_4_ = 0;
              }
              else {
                *_bisection = temp;
                ref_mpi_local._4_4_ = 0;
              }
            }
            else {
              *_bisection = high_val;
              ref_mpi_local._4_4_ = 0;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                   ,0x1a8,"ref_search_selection",(ulong)uVar3,"bcast");
            ref_mpi_local._4_4_ = uVar3;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
                 0x1a7,"ref_search_selection",(ulong)uVar3,"max");
          ref_mpi_local._4_4_ = uVar3;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
               0x1a5,"ref_search_selection",(ulong)uVar3,"bcast");
        ref_mpi_local._4_4_ = uVar3;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
             0x1a4,"ref_search_selection",(ulong)uVar3,"min");
      ref_mpi_local._4_4_ = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x19b,
           "ref_search_selection",(ulong)uVar3,"high_pos");
    ref_mpi_local._4_4_ = uVar3;
  }
  return ref_mpi_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_search_selection(REF_MPI ref_mpi, REF_INT n,
                                        REF_DBL *elements, REF_LONG position,
                                        REF_DBL *value) {
  REF_INT i, bisection;
  REF_LONG low_pos, high_pos, count;
  REF_DBL low_val, high_val, temp, mid_val;
  low_pos = 0;
  high_pos = (REF_LONG)n;
  RSS(ref_mpi_allsum(ref_mpi, &high_pos, 1, REF_LONG_TYPE), "high_pos");
  high_pos--;
  low_val = REF_DBL_MAX;
  high_val = REF_DBL_MIN;
  for (i = 0; i < n; i++) {
    low_val = MIN(low_val, elements[i]);
    high_val = MAX(high_val, elements[i]);
  }
  temp = low_val;
  RSS(ref_mpi_min(ref_mpi, &temp, &low_val, REF_DBL_TYPE), "min");
  RSS(ref_mpi_bcast(ref_mpi, &low_val, 1, REF_DBL_TYPE), "bcast");
  temp = high_val;
  RSS(ref_mpi_max(ref_mpi, &temp, &high_val, REF_DBL_TYPE), "max");
  RSS(ref_mpi_bcast(ref_mpi, &high_val, 1, REF_DBL_TYPE), "bcast");

  if (position <= low_pos) {
    *value = low_val;
    return REF_SUCCESS;
  }

  if (position >= high_pos) {
    *value = high_val;
    return REF_SUCCESS;
  }

  mid_val = 0.5 * (low_val + high_val); /* ensure initialized */
  for (bisection = 0; bisection < 40; bisection++) {
    mid_val = 0.5 * (low_val + high_val);
    count = 0;
    for (i = 0; i < n; i++) {
      if (elements[i] <= mid_val) count++;
    }

    RSS(ref_mpi_allsum(ref_mpi, &count, 1, REF_LONG_TYPE), "bcast");
    /* printf("pos  %ld %ld %ld val %f %f %f\n",
               low_pos, count, high_pos, low_val,
               mid_val, high_val);*/
    if (count - 1 < position) {
      low_val = mid_val;
    } else {
      high_val = mid_val;
    }
  }
  *value = mid_val;
  return REF_SUCCESS;
}